

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleLightObject
          (OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  bool bVar1;
  aiLight *this_00;
  string *psVar2;
  ulong uVar3;
  Property *pPVar4;
  char *pcVar5;
  allocator local_a9;
  undefined1 local_a8 [8];
  string typeStr;
  string local_80;
  Property *local_60;
  Property *prop;
  undefined1 local_48 [8];
  string objName;
  aiLight *light;
  aiScene *pScene_local;
  DDLNode *node_local;
  OpenGEXImporter *this_local;
  
  this_00 = (aiLight *)operator_new(0x46c);
  aiLight::aiLight(this_00);
  objName.field_2._8_8_ = this_00;
  std::vector<aiLight_*,_std::allocator<aiLight_*>_>::push_back
            (&this->m_lightCache,(value_type *)((long)&objName.field_2 + 8));
  psVar2 = ODDLParser::DDLNode::getName_abi_cxx11_(node);
  std::__cxx11::string::string((string *)local_48,(string *)psVar2);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    aiString::Set((aiString *)objName.field_2._8_8_,(string *)local_48);
  }
  this->m_currentLight = (aiLight *)objName.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_80,"type",(allocator *)(typeStr.field_2._M_local_buf + 0xf));
  pPVar4 = ODDLParser::DDLNode::findPropertyByName(node,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)(typeStr.field_2._M_local_buf + 0xf));
  local_60 = pPVar4;
  if ((pPVar4 != (Property *)0x0) && (pPVar4->m_value != (Value *)0x0)) {
    pcVar5 = ODDLParser::Value::getString(pPVar4->m_value);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_a8,pcVar5,&local_a9);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    bVar1 = std::operator==("point",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_a8);
    if (bVar1) {
      this->m_currentLight->mType = aiLightSource_POINT;
    }
    else {
      bVar1 = std::operator==("spot",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_a8);
      if (bVar1) {
        this->m_currentLight->mType = aiLightSource_SPOT;
      }
      else {
        bVar1 = std::operator==("infinite",
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_a8);
        if (bVar1) {
          this->m_currentLight->mType = aiLightSource_DIRECTIONAL;
        }
      }
    }
    std::__cxx11::string::~string((string *)local_a8);
  }
  handleNodes(this,node,pScene);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void OpenGEXImporter::handleLightObject( ODDLParser::DDLNode *node, aiScene *pScene ) {
    aiLight *light( new aiLight );
    m_lightCache.push_back( light );
    std::string objName = node->getName();
    if ( !objName.empty() ) {
        light->mName.Set( objName );
    }
    m_currentLight = light;

    Property *prop( node->findPropertyByName( "type" ) );
    if ( nullptr != prop ) {
        if ( nullptr != prop->m_value ) {
            std::string typeStr( prop->m_value->getString() );
            if ( "point" == typeStr ) {
                m_currentLight->mType = aiLightSource_POINT;
            } else if ( "spot" == typeStr ) {
                m_currentLight->mType = aiLightSource_SPOT;
            } else if ( "infinite" == typeStr ) {
                m_currentLight->mType = aiLightSource_DIRECTIONAL;
            }
        }
    }

    // parameters will be parsed normally in the tree, so just go for it
    handleNodes( node, pScene );
}